

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::InitialCheckout(cmCTestVC *this,char *command)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  size_type sVar5;
  reference cmd;
  string local_7c8 [32];
  undefined1 local_7a8 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_628 [7];
  bool result;
  OutputLogger err;
  OutputLogger out;
  value_type local_5a0;
  reference local_598;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> vc_co;
  string local_558;
  undefined1 local_538 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_518 [32];
  undefined1 local_4f8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_380 [32];
  undefined1 local_360 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_1e8 [8];
  string parent;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  char *command_local;
  cmCTestVC *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"   First perform the initial checkout: ");
  poVar3 = std::operator<<(poVar3,command);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2a,pcVar4,false);
  std::__cxx11::string::~string((string *)(parent.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_198);
  cmsys::SystemTools::GetFilenamePath((string *)local_1e8,&this->SourceDirectory);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
  poVar3 = std::operator<<((ostream *)local_360,"   Perform checkout in directory: ");
  poVar3 = std::operator<<(poVar3,(string *)local_1e8);
  std::operator<<(poVar3,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2f,pcVar4,false);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
  bVar2 = cmsys::SystemTools::MakeDirectory((string *)local_1e8,(mode_t *)0x0);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,command,
               (allocator<char> *)
               ((long)&vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    cmSystemTools::ParseArguments
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_538,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&vc_co.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_538);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,sVar5 + 1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_538);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_538);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      if (!bVar2) break;
      local_598 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      local_5a0 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,&local_5a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    out.super_LineParser.Separator = '\0';
    out.super_LineParser.LineEnd = '\0';
    out.super_LineParser.IgnoreCR = false;
    out.super_LineParser._59_5_ = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
               (value_type *)&out.super_LineParser.Separator);
    std::operator<<(this->Log,"--- Begin Initial Checkout ---\n");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&err.super_LineParser.Separator,this->Log,"co-out> ");
    cmProcessTools::OutputLogger::OutputLogger((OutputLogger *)local_628,this->Log,"co-err> ");
    cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         RunChild(this,cmd,(OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_628
                  ,pcVar4,Auto);
    std::operator<<(this->Log,"--- End Initial Checkout ---\n");
    if (!this_local._7_1_) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a8);
      poVar3 = std::operator<<((ostream *)local_7a8,"Initial checkout failed!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
                   ,0x47,pcVar4,false);
      std::__cxx11::string::~string(local_7c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a8);
    }
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_628);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err.super_LineParser.Separator);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_538);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
    poVar3 = std::operator<<((ostream *)local_4f8,"Cannot create directory: ");
    poVar3 = std::operator<<(poVar3,(string *)local_1e8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
                 ,0x32,pcVar4,false);
    std::__cxx11::string::~string(local_518);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
    this_local._7_1_ = false;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_1e8);
  return this_local._7_1_;
}

Assistant:

bool cmCTestVC::InitialCheckout(const char* command)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   First perform the initial checkout: " << command << "\n");

  // Make the parent directory in which to perform the checkout.
  std::string parent = cmSystemTools::GetFilenamePath(this->SourceDirectory);
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Perform checkout in directory: " << parent << "\n");
  if (!cmSystemTools::MakeDirectory(parent)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create directory: " << parent << std::endl);
    return false;
  }

  // Construct the initial checkout command line.
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);
  std::vector<char const*> vc_co;
  vc_co.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    vc_co.push_back(arg.c_str());
  }
  vc_co.push_back(nullptr);

  // Run the initial checkout command and log its output.
  this->Log << "--- Begin Initial Checkout ---\n";
  OutputLogger out(this->Log, "co-out> ");
  OutputLogger err(this->Log, "co-err> ");
  bool result = this->RunChild(&vc_co[0], &out, &err, parent.c_str());
  this->Log << "--- End Initial Checkout ---\n";
  if (!result) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Initial checkout failed!" << std::endl);
  }
  return result;
}